

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_PluginTest_DisablesPluginsDontRun_TestShell::createTest
          (TEST_PluginTest_DisablesPluginsDontRun_TestShell *this)

{
  TEST_PluginTest_DisablesPluginsDontRun_Test *this_00;
  
  this_00 = (TEST_PluginTest_DisablesPluginsDontRun_Test *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                         ,0xad);
  TEST_PluginTest_DisablesPluginsDontRun_Test::TEST_PluginTest_DisablesPluginsDontRun_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(PluginTest, DisablesPluginsDontRun)
{
    registry->installPlugin(thirdPlugin);
    thirdPlugin->disable();
    genFixture->runAllTests();
    CHECK(!thirdPlugin->isEnabled());
    thirdPlugin->enable();
    genFixture->runAllTests();
    CHECK_EQUAL(2, firstPlugin->preAction);
    CHECK_EQUAL(1, thirdPlugin->preAction);
    CHECK(thirdPlugin->isEnabled());
}